

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTF2Exporter.cpp
# Opt level: O2

void __thiscall Assimp::glTF2Exporter::ExportMetadata(glTF2Exporter *this)

{
  element_type *peVar1;
  aiMetadata *this_00;
  bool bVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  allocator<char> local_559;
  string local_558;
  char buffer [256];
  aiString copyright_str;
  
  peVar1 = (this->mAsset).super___shared_ptr<glTF2::Asset,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  std::__cxx11::string::assign((char *)&(peVar1->asset).version);
  uVar3 = aiGetVersionMajor();
  uVar4 = aiGetVersionMinor();
  uVar5 = aiGetVersionRevision();
  snprintf(buffer,0x100,"Open Asset Import Library (assimp v%d.%d.%d)",(ulong)uVar3,(ulong)uVar4,
           (ulong)uVar5);
  std::__cxx11::string::assign((char *)&(peVar1->asset).generator);
  copyright_str.length = 0;
  copyright_str.data[0] = '\0';
  memset(copyright_str.data + 1,0x1b,0x3ff);
  this_00 = this->mScene->mMetaData;
  if (this_00 != (aiMetadata *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_558,"SourceAsset_Copyright",&local_559);
    bVar2 = aiMetadata::Get<aiString>(this_00,&local_558,&copyright_str);
    std::__cxx11::string::~string((string *)&local_558);
    if (bVar2) {
      std::__cxx11::string::assign((char *)&peVar1->asset);
    }
  }
  return;
}

Assistant:

void glTF2Exporter::ExportMetadata()
{
    AssetMetadata& asset = mAsset->asset;
    asset.version = "2.0";

    char buffer[256];
    ai_snprintf(buffer, 256, "Open Asset Import Library (assimp v%d.%d.%d)",
        aiGetVersionMajor(), aiGetVersionMinor(), aiGetVersionRevision());

    asset.generator = buffer;

    // Copyright
	aiString copyright_str;
	if (mScene->mMetaData != nullptr && mScene->mMetaData->Get(AI_METADATA_SOURCE_COPYRIGHT, copyright_str)) {
        asset.copyright = copyright_str.C_Str();
	}
}